

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O3

void Vec_IntPushOrderAbs(Vec_Int_t *p,int Entry)

{
  size_t __size;
  uint uVar1;
  bool bVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  uVar5 = p->nSize;
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      if (p->pArray[uVar4] == Entry) {
        __assert_fail("Entry != p->pArray[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                      ,0xd4,"void Vec_IntPushOrderAbs(Vec_Int_t *, int)");
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (uVar5 == p->nCap) {
    if ((int)uVar5 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar7 = 0x10;
      if (piVar3 == (int *)0x0) {
LAB_0067592d:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    else {
      __size = (ulong)uVar5 * 8;
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(__size);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,__size);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_0067592d;
      iVar7 = uVar5 * 2;
    }
    p->nCap = iVar7;
  }
  uVar4 = (ulong)p->nSize;
  p->nSize = p->nSize + 1;
  piVar3 = p->pArray;
  if (0 < (long)uVar4) {
    uVar5 = -Entry;
    if (0 < Entry) {
      uVar5 = Entry;
    }
    do {
      uVar1 = piVar3[uVar4 - 1];
      uVar6 = -uVar1;
      if (0 < (int)uVar1) {
        uVar6 = uVar1;
      }
      if (uVar5 <= uVar6) goto LAB_00675903;
      piVar3[uVar4] = uVar1;
      bVar2 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    uVar4 = 0;
  }
LAB_00675903:
  piVar3[(int)uVar4] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrderAbs( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        assert( Entry != p->pArray[i] );
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( Abc_AbsInt(p->pArray[i]) < Abc_AbsInt(Entry) )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}